

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomModelValidator.cpp
# Opt level: O0

Result * CoreML::validate<(MLModelType)555>(Result *__return_storage_ptr__,Model *format)

{
  ModelDescription *interface_00;
  bool bVar1;
  int32_t modelVersion;
  ValueCase VVar2;
  ulong uVar3;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>
  *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  allocator<char> local_149;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_128;
  value_type *param;
  const_iterator __end1;
  const_iterator __begin1;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>
  *__range1;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>
  *parameters;
  string local_d8;
  CustomModel *local_b8;
  CustomModel *customModel;
  Result local_a8;
  undefined1 local_80 [8];
  Result result;
  allocator<char> local_41;
  string local_40;
  ModelDescription *local_20;
  ModelDescription *interface;
  Model *format_local;
  
  interface = (ModelDescription *)format;
  format_local = (Model *)__return_storage_ptr__;
  local_20 = Specification::Model::description(format);
  bVar1 = Specification::Model::has_custommodel((Model *)interface);
  if (bVar1) {
    Result::Result((Result *)local_80);
    interface_00 = local_20;
    modelVersion = Specification::Model::specificationversion((Model *)interface);
    ValidationPolicy::ValidationPolicy((ValidationPolicy *)((long)&customModel + 4));
    validateModelDescription
              (&local_a8,interface_00,modelVersion,(ValidationPolicy *)((long)&customModel + 4));
    Result::operator=((Result *)local_80,&local_a8);
    Result::~Result(&local_a8);
    bVar1 = Result::good((Result *)local_80);
    if (bVar1) {
      local_b8 = Specification::Model::custommodel((Model *)interface);
      Specification::CustomModel::classname_abi_cxx11_(local_b8);
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        this = Specification::CustomModel::parameters_abi_cxx11_(local_b8);
        google::protobuf::
        Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>
        ::begin((const_iterator *)&__end1.it_.bucket_index_,this);
        google::protobuf::
        Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>
        ::end((const_iterator *)&param,this);
        while( true ) {
          bVar1 = google::protobuf::operator!=
                            ((const_iterator *)&__end1.it_.bucket_index_,(const_iterator *)&param);
          if (!bVar1) break;
          local_128 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      google::protobuf::
                      Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>
                      ::const_iterator::operator*((const_iterator *)&__end1.it_.bucket_index_);
          uVar3 = std::__cxx11::string::empty();
          if ((uVar3 & 1) != 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_148,
                       "CustomModel.parameters must have non-empty string keys.",&local_149);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_148);
            std::__cxx11::string::~string((string *)&local_148);
            std::allocator<char>::~allocator(&local_149);
            goto LAB_00426b93;
          }
          VVar2 = Specification::CustomModel_CustomModelParamValue::value_case
                            ((CustomModel_CustomModelParamValue *)(local_128 + 1));
          if (VVar2 == VALUE_NOT_SET) {
            std::operator+(&local_190,"CustomModel.parameters[\'",local_128);
            std::operator+(&local_170,&local_190,"\'] does not have a set value");
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_170);
            std::__cxx11::string::~string((string *)&local_170);
            std::__cxx11::string::~string((string *)&local_190);
            goto LAB_00426b93;
          }
          google::protobuf::
          Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>
          ::const_iterator::operator++((const_iterator *)&__end1.it_.bucket_index_);
        }
        Result::Result(__return_storage_ptr__,(Result *)local_80);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d8,"CustomModel must have non-empty className.",
                   (allocator<char> *)((long)&parameters + 7));
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_d8);
        std::__cxx11::string::~string((string *)&local_d8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&parameters + 7));
      }
    }
    else {
      Result::Result(__return_storage_ptr__,(Result *)local_80);
    }
LAB_00426b93:
    customModel._0_4_ = 1;
    Result::~Result((Result *)local_80);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Model not an a CustomModel.",&local_41);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_customModel>(const Specification::Model& format) {
        const auto& interface = format.description();

        // Make sure that if there is a double output type, there is exactly one output index selected.
        if(!format.has_custommodel()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "Model not an a CustomModel.");
        }
        
        Result result;

        result = validateModelDescription(interface, format.specificationversion());
        if (!result.good()) {
            return result;
        }

        const auto& customModel = format.custommodel();

        if (customModel.classname().empty()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "CustomModel must have non-empty className.");
        }

        const auto& parameters = customModel.parameters();
        for(const auto& param : parameters) {
            if (param.first.empty()) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "CustomModel.parameters must have non-empty string keys.");
            }

            switch (param.second.value_case()) {
                case Specification::CustomModel_CustomModelParamValue::VALUE_NOT_SET:
                    return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                  "CustomModel.parameters['"+param.first+"'] does not have a set value");
                default:
                    break;
            }
        }

        return result;
    }